

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O2

void __thiscall
SemanticAnalyserTest_VariableCallWorks_Test::~SemanticAnalyserTest_VariableCallWorks_Test
          (SemanticAnalyserTest_VariableCallWorks_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, VariableCallWorks)
{
  std::string source = R"SRC(  
  fn main(): f32
  {
    let x: function = print;
    print("test");
    ret 0;
  }
  )SRC";
  nothrowTest(source);
}